

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O3

EffectState * __thiscall
anon_unknown.dwarf_1368b5::ChorusStateFactory::create(ChorusStateFactory *this)

{
  EffectState *pEVar1;
  size_t in_RSI;
  
  pEVar1 = (EffectState *)
           (anonymous_namespace)::ChorusState::operator_new((ChorusState *)this,in_RSI);
  memset(&pEVar1->super_intrusive_ref<EffectState>,0,0x158);
  (pEVar1->super_intrusive_ref<EffectState>).mRef.super___atomic_base<unsigned_int>._M_i = 1;
  (pEVar1->mOutTarget).mData = (pointer)0x0;
  (pEVar1->mOutTarget).mDataEnd = (pointer)0x0;
  pEVar1->_vptr_EffectState = (_func_int **)&PTR__ChorusState_001af498;
  pEVar1[1]._vptr_EffectState = (_func_int **)0x0;
  *(undefined8 *)&pEVar1[1].super_intrusive_ref<EffectState> = 0;
  pEVar1[1].mOutTarget.mData = (pointer)0x0;
  pEVar1[1].mOutTarget.mDataEnd = (pointer)0x0;
  *(undefined4 *)&pEVar1[2]._vptr_EffectState = 1;
  memset((void *)((long)&pEVar1[2]._vptr_EffectState + 4),0,0x118);
  return pEVar1;
}

Assistant:

EffectState *create() override { return new ChorusState{}; }